

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::anon_unknown_6::ScanLineProcess::run_decode
          (ScanLineProcess *this,exr_const_context_t ctxt,int pn,FrameBuffer *outfb,int fbY,
          int fbLastY,vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist)

{
  exr_decode_pipeline_t *peVar1;
  int iVar2;
  IoExc *this_00;
  
  this->last_decode_err = 0x21;
  peVar1 = &this->decoder;
  if (this->first == true) {
    iVar2 = exr_decoding_initialize(ctxt,pn,&this->cinfo,peVar1);
    if (iVar2 != 0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_00,"Unable to initialize decode pipeline");
      goto LAB_0019e33b;
    }
    this->first = false;
    update_pointers(this,outfb,fbY,fbLastY);
    iVar2 = exr_decoding_choose_default_routines(ctxt,pn,peVar1);
    if (iVar2 != 0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_00,"Unable to choose decoder routines");
      goto LAB_0019e33b;
    }
  }
  else {
    iVar2 = exr_decoding_update(ctxt,pn,&this->cinfo,peVar1);
    if (iVar2 != 0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_00,"Unable to update decode pipeline");
      goto LAB_0019e33b;
    }
    update_pointers(this,outfb,fbY,fbLastY);
  }
  iVar2 = exr_decoding_run(ctxt,pn,peVar1);
  this->last_decode_err = iVar2;
  if (iVar2 == 0) {
    run_fill(this,(FrameBuffer *)(ulong)(uint)fbY,
             (int)(filllist->super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>).
                  _M_impl.super__Vector_impl_data._M_start,
             (vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *)
             (filllist->super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>)._M_impl
             .super__Vector_impl_data._M_finish);
    return;
  }
  this_00 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::IoExc::IoExc(this_00,"Unable to run decoder");
LAB_0019e33b:
  __cxa_throw(this_00,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
}

Assistant:

void ScanLineProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const FrameBuffer *outfb,
    int fbY,
    int fbLastY,
    const std::vector<Slice> &filllist)
{
    last_decode_err = EXR_ERR_UNKNOWN;
    // stash the flag off to make sure to clean up in the event
    // of an exception by changing the flag after init...
    bool isfirst = first;
    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
    }

    update_pointers (outfb, fbY, fbLastY);

    if (isfirst)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    run_fill (outfb, fbY, filllist);
}